

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O2

bool CheckConfigFileVariable
               (TCascStorage *hs,char *szLinePtr,char *szLineEnd,char *szVarName,
               PARSE_VARIABLE PfnParseProc,void *pvParseParam)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  byte *pbVar5;
  char szVariableName [80];
  byte local_78 [80];
  
  for (; (szLinePtr < szLineEnd && ((byte)*szLinePtr < 0x21));
      szLinePtr = (char *)((byte *)szLinePtr + 1)) {
  }
  uVar4 = 0;
  do {
    pbVar5 = (byte *)szLinePtr + uVar4;
    if ((szLineEnd <= pbVar5) || (0x4e < uVar4)) {
      local_78[uVar4] = 0;
      if ((byte *)szLinePtr + uVar4 != (byte *)0x0) {
LAB_00112cca:
        bVar2 = CheckWildCard((char *)local_78,szVarName);
        if (bVar2) {
          for (; pbVar5 < szLineEnd; pbVar5 = pbVar5 + 1) {
            if (0x20 < *pbVar5 && *pbVar5 != 0x3d) {
              iVar3 = (*PfnParseProc)(hs,(char *)local_78,(char *)pbVar5,szLineEnd,pvParseParam);
              return iVar3 == 0;
            }
          }
        }
      }
      return false;
    }
    bVar1 = *pbVar5;
    if ((bVar1 < 0x21) || (bVar1 == 0x3d)) {
      local_78[uVar4] = 0;
      goto LAB_00112cca;
    }
    local_78[uVar4] = bVar1;
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

static bool CheckConfigFileVariable(
    TCascStorage * hs,                  // Pointer to storage structure
    const char * szLinePtr,             // Pointer to the begin of the line
    const char * szLineEnd,             // Pointer to the end of the line
    const char * szVarName,             // Pointer to the variable to check
    PARSE_VARIABLE PfnParseProc,        // Pointer to the parsing function
    void * pvParseParam)                // Pointer to the parameter passed to parsing function
{
    char szVariableName[MAX_VAR_NAME];

    // Capture the variable from the line
    szLinePtr = CaptureSingleString(szLinePtr, szLineEnd, szVariableName, sizeof(szVariableName));
    if (szLinePtr == NULL)
        return false;

    // Verify whether this is the variable
    if (!CheckWildCard(szVariableName, szVarName))
        return false;

    // Skip the spaces and '='
    while (szLinePtr < szLineEnd && (IsWhiteSpace(szLinePtr) || szLinePtr[0] == '='))
        szLinePtr++;

    // Call the parsing function only if there is some data
    if (szLinePtr >= szLineEnd)
        return false;

    return (PfnParseProc(hs, szVariableName, szLinePtr, szLineEnd, pvParseParam) == ERROR_SUCCESS);
}